

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool quasiLexicographicalReverseLessThan(QFileInfo *fi1,QFileInfo *fi2)

{
  qsizetype qVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QString s2;
  QString s1;
  QString *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool local_39;
  QString local_38;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QFileInfo::baseName();
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_38.d.size = -0x5555555555555556;
  QFileInfo::baseName();
  qVar1 = QString::size(&local_20);
  qVar2 = QString::size(&local_38);
  if (qVar1 == qVar2) {
    local_39 = operator>((QString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
  }
  else {
    qVar1 = QString::size(&local_20);
    qVar2 = QString::size(&local_38);
    local_39 = qVar2 < qVar1;
  }
  QString::~QString((QString *)0x10ca8a);
  QString::~QString((QString *)0x10ca94);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool quasiLexicographicalReverseLessThan(const QFileInfo &fi1, const QFileInfo &fi2)
{
    QString s1 = fi1.baseName();
    QString s2 = fi2.baseName();

    if (s1.size() == s2.size())
        return s1 > s2;
    else
        return s1.size() > s2.size();
}